

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Dequantize_x86_avx::forward
          (Dequantize_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  long in_RCX;
  long *in_RDX;
  long *in_RSI;
  Mat *bias_data;
  long in_RDI;
  Mat bias_data_q;
  Mat scale_data_q;
  float *ptr_2;
  int *intptr_2;
  int q;
  Mat bias_data_i;
  Mat scale_data_i;
  float *ptr_1;
  int *intptr_1;
  int i_1;
  int size;
  float *ptr;
  int *intptr;
  int i;
  int ii;
  int nn_w;
  int wp;
  int elempack;
  int channels;
  int h;
  int w;
  int dims;
  Mat *m;
  Mat *m_1;
  Allocator *in_stack_fffffffffffff840;
  undefined8 *puVar2;
  Mat *in_stack_fffffffffffff848;
  void **ppvVar3;
  Mat *in_stack_fffffffffffff850;
  bool local_6c9;
  void *local_6c8;
  int *local_6c0;
  undefined8 local_6b8;
  undefined4 local_6b0;
  long *local_6a8;
  undefined4 local_6a0;
  int local_69c;
  undefined4 local_698;
  undefined4 local_694;
  undefined4 local_690;
  int in_stack_fffffffffffff978;
  int elempack_00;
  int in_stack_fffffffffffff97c;
  int elemcount;
  Mat *in_stack_fffffffffffff980;
  Mat *in_stack_fffffffffffff988;
  Mat *scale_data;
  float *in_stack_fffffffffffff990;
  float *ptr_00;
  undefined4 uVar4;
  int *in_stack_fffffffffffff998;
  long *local_660;
  undefined8 local_638;
  undefined8 local_630;
  undefined8 local_628;
  undefined4 local_620;
  long local_618;
  undefined4 local_610;
  undefined4 local_60c;
  undefined4 local_608;
  undefined4 local_604;
  undefined4 local_600;
  undefined8 local_5f8;
  long local_5f0;
  undefined8 local_5e8;
  undefined8 local_5e0;
  undefined8 local_5d8;
  undefined4 local_5d0;
  long local_5c8;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  undefined4 local_5b4;
  undefined4 local_5b0;
  undefined8 local_5a8;
  long local_5a0;
  int local_598;
  void *local_588;
  int *local_580;
  undefined8 local_578;
  undefined4 local_570;
  long *local_568;
  undefined4 local_560;
  int local_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 local_550;
  long local_548;
  void *local_540;
  int *local_538;
  undefined8 local_530;
  undefined4 local_528;
  long *local_520;
  undefined4 local_518;
  int local_514;
  undefined4 local_510;
  undefined4 local_50c;
  undefined4 local_508;
  long local_500;
  long local_4f8;
  long local_4f0;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  long local_4d8;
  long local_4d0;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  int local_4b8 [3];
  int local_4ac;
  int local_4a8;
  int local_4a4;
  int local_4a0;
  int local_49c;
  long local_498;
  long *local_490;
  long *local_488;
  int local_474;
  long *local_470;
  undefined8 *local_468;
  long *local_460;
  undefined8 *local_458;
  long *local_450;
  int local_444;
  long *local_440;
  int local_434;
  long *local_430;
  int local_428;
  int local_424;
  long *local_420;
  void **local_418;
  int local_410;
  int local_40c;
  long *local_408;
  undefined1 *local_400;
  int local_3f8;
  int local_3f4;
  long *local_3f0;
  void **local_3e8;
  int local_3e0;
  int local_3dc;
  long *local_3d8;
  void **local_3d0;
  long *local_3c8;
  void **local_3c0;
  long *local_3b8;
  void **local_3b0;
  undefined8 *local_3a8;
  undefined1 *local_3a0;
  long *local_398;
  void **local_390;
  void **local_388;
  void **local_378;
  undefined8 *local_368;
  undefined8 *local_358;
  void **local_348;
  undefined8 *local_338;
  undefined1 local_325;
  int local_324;
  undefined8 *local_318;
  undefined1 local_305;
  int local_304;
  undefined8 *local_2f8;
  long *local_2e8;
  long *local_2e0;
  undefined4 local_2d4;
  undefined8 local_2d0;
  void *local_2c8;
  int local_2bc;
  void **local_2b8;
  long *local_2b0;
  undefined4 local_2a4;
  undefined8 local_2a0;
  void *local_298;
  int local_28c;
  void **local_288;
  long *local_280;
  undefined4 local_274;
  float *local_270;
  Mat *local_268;
  int local_25c;
  undefined1 *local_258;
  long *local_250;
  undefined4 local_244;
  undefined8 local_240;
  void *local_238;
  int local_22c;
  void **local_228;
  int local_220;
  undefined4 local_21c;
  void **local_218;
  undefined4 local_210;
  undefined4 local_20c;
  undefined1 *local_208;
  int local_200;
  undefined4 local_1fc;
  void **local_1f8;
  int local_1f0;
  undefined4 local_1ec;
  void **local_1e8;
  int local_1b0;
  undefined4 local_1ac;
  undefined8 *local_1a8;
  int local_190;
  undefined4 local_18c;
  void **local_188;
  undefined8 *local_168;
  undefined8 *local_148;
  int local_130;
  undefined4 local_12c;
  void **local_128;
  int local_110;
  undefined4 local_10c;
  void **local_108;
  void *local_100;
  void *local_f0;
  void *local_c0;
  long local_90;
  undefined4 local_84;
  long local_80;
  long local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  long local_58;
  undefined4 local_4c;
  long local_48;
  long local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_49c = (int)in_RSI[5];
  local_4a0 = *(int *)((long)in_RSI + 0x2c);
  local_4a4 = (int)in_RSI[6];
  local_4a8 = (int)in_RSI[7];
  local_4ac = (int)in_RSI[3];
  local_498 = in_RCX;
  local_490 = in_RDX;
  local_488 = in_RSI;
  Mat::create_like(in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  local_470 = local_490;
  local_6c9 = true;
  if (*local_490 != 0) {
    local_2e8 = local_490;
    local_6c9 = local_490[8] * (long)(int)local_490[7] == 0;
  }
  if (local_6c9) {
    local_474 = -100;
  }
  else {
    if (local_49c == 1) {
      local_4b8[1] = 1;
      local_4b8[0] = local_4a0 / *(int *)(local_498 + 4);
      piVar1 = std::max<int>(local_4b8 + 1,local_4b8);
      local_4b8[2] = *piVar1;
      local_4bc = (local_4a0 + local_4b8[2] + -1) / local_4b8[2];
      for (local_4c0 = 0; local_4c0 < local_4bc; local_4c0 = local_4c0 + 1) {
        local_4c4 = local_4c0 * local_4b8[2];
        local_460 = local_488;
        local_4d0 = *local_488 + (long)(local_4c4 * local_4ac) * 4;
        local_450 = local_490;
        local_4d8 = *local_490 + (long)(local_4c4 * local_4ac) * 4;
        local_4e0 = local_4a0 - local_4c4;
        piVar1 = std::min<int>(&local_4e0,local_4b8 + 2);
        local_4dc = *piVar1 * local_4ac;
        dequantize(in_stack_fffffffffffff998,in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                   in_stack_fffffffffffff980,in_stack_fffffffffffff97c,in_stack_fffffffffffff978);
      }
    }
    if (local_49c == 2) {
      for (local_4e4 = 0; local_4e4 < local_4a4; local_4e4 = local_4e4 + 1) {
        local_440 = local_488;
        local_444 = local_4e4;
        local_4f0 = *local_488 +
                    (long)*(int *)((long)local_488 + 0x2c) * (long)local_4e4 * local_488[2];
        local_430 = local_490;
        local_434 = local_4e4;
        local_4f8 = *local_490 +
                    (long)*(int *)((long)local_490 + 0x2c) * (long)local_4e4 * local_490[2];
        if (*(int *)(in_RDI + 0xd0) < 2) {
          local_3c8 = (long *)(in_RDI + 0xd8);
          local_3c0 = &local_540;
          local_540 = (void *)*local_3c8;
          local_538 = *(int **)(in_RDI + 0xe0);
          local_530 = *(undefined8 *)(in_RDI + 0xe8);
          local_528 = *(undefined4 *)(in_RDI + 0xf0);
          local_520 = *(long **)(in_RDI + 0xf8);
          local_518 = *(undefined4 *)(in_RDI + 0x100);
          local_514 = *(int *)(in_RDI + 0x104);
          local_510 = *(undefined4 *)(in_RDI + 0x108);
          local_50c = *(undefined4 *)(in_RDI + 0x10c);
          local_508 = *(undefined4 *)(in_RDI + 0x110);
          local_500 = *(long *)(in_RDI + 0x118);
          local_1e8 = local_3c0;
          if (local_538 != (int *)0x0) {
            local_1ec = 1;
            LOCK();
            local_1f0 = *local_538;
            *local_538 = *local_538 + 1;
            UNLOCK();
          }
        }
        else {
          local_3d8 = (long *)(in_RDI + 0xd8);
          local_3dc = local_4e4 * local_4ac;
          local_3d0 = &local_540;
          local_3e0 = local_4ac;
          local_2c8 = (void *)(*local_3d8 + (long)local_3dc * *(long *)(in_RDI + 0xe8));
          local_2d0 = *(undefined8 *)(in_RDI + 0xe8);
          local_2d4 = *(undefined4 *)(in_RDI + 0xf0);
          local_2e0 = *(long **)(in_RDI + 0xf8);
          local_2b8 = &local_540;
          local_2bc = local_4ac;
          local_538 = (int *)0x0;
          local_518 = 1;
          local_514 = local_4ac;
          local_510 = 1;
          local_50c = 1;
          local_508 = 1;
          local_500 = (long)local_4ac;
          local_540 = local_2c8;
          local_530 = local_2d0;
          local_528 = local_2d4;
          local_520 = local_2e0;
        }
        if (*(int *)(in_RDI + 0xd4) < 2) {
          local_3b8 = (long *)(in_RDI + 0x120);
          local_3b0 = &local_588;
          local_588 = (void *)*local_3b8;
          local_580 = *(int **)(in_RDI + 0x128);
          local_578 = *(undefined8 *)(in_RDI + 0x130);
          local_570 = *(undefined4 *)(in_RDI + 0x138);
          local_568 = *(long **)(in_RDI + 0x140);
          local_560 = *(undefined4 *)(in_RDI + 0x148);
          local_55c = *(int *)(in_RDI + 0x14c);
          local_558 = *(undefined4 *)(in_RDI + 0x150);
          local_554 = *(undefined4 *)(in_RDI + 0x154);
          local_550 = *(undefined4 *)(in_RDI + 0x158);
          local_548 = *(long *)(in_RDI + 0x160);
          local_1f8 = local_3b0;
          if (local_580 != (int *)0x0) {
            local_1fc = 1;
            LOCK();
            local_200 = *local_580;
            *local_580 = *local_580 + 1;
            UNLOCK();
          }
        }
        else {
          local_3f0 = (long *)(in_RDI + 0x120);
          local_3f4 = local_4e4 * local_4ac;
          local_3e8 = &local_588;
          local_3f8 = local_4ac;
          local_298 = (void *)(*local_3f0 + (long)local_3f4 * *(long *)(in_RDI + 0x130));
          local_2a0 = *(undefined8 *)(in_RDI + 0x130);
          local_2a4 = *(undefined4 *)(in_RDI + 0x138);
          local_2b0 = *(long **)(in_RDI + 0x140);
          local_288 = &local_588;
          local_28c = local_4ac;
          local_580 = (int *)0x0;
          local_560 = 1;
          local_55c = local_4ac;
          local_558 = 1;
          local_554 = 1;
          local_550 = 1;
          local_548 = (long)local_4ac;
          local_588 = local_298;
          local_578 = local_2a0;
          local_570 = local_2a4;
          local_568 = local_2b0;
        }
        dequantize(in_stack_fffffffffffff998,in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                   in_stack_fffffffffffff980,in_stack_fffffffffffff97c,in_stack_fffffffffffff978);
        local_388 = &local_588;
        local_108 = local_388;
        if (local_580 != (int *)0x0) {
          local_10c = 0xffffffff;
          LOCK();
          local_110 = *local_580;
          *local_580 = *local_580 + -1;
          UNLOCK();
          if (local_110 == 1) {
            if (local_568 == (long *)0x0) {
              local_100 = local_588;
              if (local_588 != (void *)0x0) {
                free(local_588);
              }
            }
            else {
              (**(code **)(*local_568 + 0x18))(local_568,local_588);
            }
          }
        }
        local_588 = (void *)0x0;
        local_578 = 0;
        local_570 = 0;
        local_560 = 0;
        local_55c = 0;
        local_558 = 0;
        local_554 = 0;
        local_550 = 0;
        local_548 = 0;
        local_580 = (int *)0x0;
        local_378 = &local_540;
        local_128 = local_378;
        if (local_538 != (int *)0x0) {
          local_12c = 0xffffffff;
          LOCK();
          local_130 = *local_538;
          *local_538 = *local_538 + -1;
          UNLOCK();
          if (local_130 == 1) {
            if (local_520 == (long *)0x0) {
              local_f0 = local_540;
              if (local_540 != (void *)0x0) {
                free(local_540);
              }
            }
            else {
              (**(code **)(*local_520 + 0x18))(local_520,local_540);
            }
          }
        }
        local_540 = (void *)0x0;
        local_530 = 0;
        local_528 = 0;
        local_518 = 0;
        local_514 = 0;
        local_510 = 0;
        local_50c = 0;
        local_508 = 0;
        local_500 = 0;
        local_538 = (int *)0x0;
      }
    }
    if (local_49c == 3) {
      for (local_598 = 0; local_598 < local_4a8; local_598 = local_598 + 1) {
        local_318 = &local_5e8;
        local_2c = *(int *)((long)local_488 + 0x2c);
        local_30 = (int)local_488[6];
        local_34 = *(undefined4 *)((long)local_488 + 0x34);
        local_5a0 = *local_488 + local_488[8] * (long)local_598 * local_488[2];
        local_48 = local_488[2];
        local_4c = (undefined4)local_488[3];
        local_58 = local_488[4];
        local_28 = &local_5e8;
        local_18 = (long)local_2c * (long)local_30 * local_48;
        local_468 = &local_5e8;
        local_368 = &local_5e8;
        local_2f8 = &local_638;
        local_64 = *(int *)((long)local_490 + 0x2c);
        local_68 = (int)local_490[6];
        local_6c = *(undefined4 *)((long)local_490 + 0x34);
        local_5f0 = *local_490 + local_490[8] * (long)local_598 * local_490[2];
        local_80 = local_490[2];
        local_84 = (undefined4)local_490[3];
        local_90 = local_490[4];
        local_60 = &local_638;
        local_8 = (long)local_64 * (long)local_68 * local_80;
        local_458 = &local_638;
        local_358 = &local_638;
        local_5b0 = 0;
        local_5b4 = 0;
        local_5b8 = 0;
        local_5bc = 0;
        local_5d0 = 0;
        local_5d8 = 0;
        local_5e0 = 0;
        local_5e8 = 0;
        local_c = 0x10;
        local_1c = 0x10;
        local_304 = local_598;
        local_305 = 1;
        local_324 = local_598;
        local_325 = 1;
        local_5a8 = 0;
        local_5c0 = 0;
        local_638 = 0;
        local_628 = 0;
        local_620 = 0;
        local_610 = 0;
        local_60c = 0;
        local_608 = 0;
        local_604 = 0;
        local_600 = 0;
        local_5f8 = 0;
        local_630 = 0;
        if (*(int *)(in_RDI + 0xd0) < 2) {
          local_3a8 = (undefined8 *)(in_RDI + 0xd8);
          local_3a0 = &stack0xfffffffffffff980;
          bias_data = (Mat *)*local_3a8;
          scale_data = *(Mat **)(in_RDI + 0xe0);
          ptr_00 = *(float **)(in_RDI + 0xe8);
          uVar4 = *(undefined4 *)(in_RDI + 0xf0);
          local_660 = *(long **)(in_RDI + 0xf8);
          local_208 = local_3a0;
          if (scale_data != (Mat *)0x0) {
            local_20c = 1;
            LOCK();
            local_210 = *(undefined4 *)&scale_data->data;
            *(int *)&scale_data->data = *(int *)&scale_data->data + 1;
            UNLOCK();
          }
        }
        else {
          local_408 = (long *)(in_RDI + 0xd8);
          local_40c = local_598 * local_4ac;
          local_400 = &stack0xfffffffffffff980;
          local_410 = local_4ac;
          bias_data = (Mat *)(*local_408 + (long)local_40c * *(long *)(in_RDI + 0xe8));
          ptr_00 = *(float **)(in_RDI + 0xe8);
          local_274 = *(undefined4 *)(in_RDI + 0xf0);
          local_280 = *(long **)(in_RDI + 0xf8);
          local_258 = &stack0xfffffffffffff980;
          local_25c = local_4ac;
          scale_data = (Mat *)0x0;
          local_270 = ptr_00;
          local_268 = bias_data;
          local_660 = local_280;
        }
        if (*(int *)(in_RDI + 0xd4) < 2) {
          local_398 = (long *)(in_RDI + 0x120);
          local_390 = &local_6c8;
          local_6c8 = (void *)*local_398;
          local_6c0 = *(int **)(in_RDI + 0x128);
          local_6b8 = *(undefined8 *)(in_RDI + 0x130);
          local_6b0 = *(undefined4 *)(in_RDI + 0x138);
          local_6a8 = *(long **)(in_RDI + 0x140);
          local_6a0 = *(undefined4 *)(in_RDI + 0x148);
          local_69c = *(int *)(in_RDI + 0x14c);
          local_698 = *(undefined4 *)(in_RDI + 0x150);
          local_694 = *(undefined4 *)(in_RDI + 0x154);
          local_690 = *(undefined4 *)(in_RDI + 0x158);
          elemcount = (int)((ulong)*(undefined8 *)(in_RDI + 0x160) >> 0x20);
          elempack_00 = (int)*(undefined8 *)(in_RDI + 0x160);
          local_218 = local_390;
          if (local_6c0 != (int *)0x0) {
            local_21c = 1;
            LOCK();
            local_220 = *local_6c0;
            *local_6c0 = *local_6c0 + 1;
            UNLOCK();
          }
        }
        else {
          local_420 = (long *)(in_RDI + 0x120);
          local_424 = local_598 * local_4ac;
          local_418 = &local_6c8;
          local_428 = local_4ac;
          local_238 = (void *)(*local_420 + (long)local_424 * *(long *)(in_RDI + 0x130));
          local_240 = *(undefined8 *)(in_RDI + 0x130);
          local_244 = *(undefined4 *)(in_RDI + 0x138);
          local_250 = *(long **)(in_RDI + 0x140);
          local_228 = &local_6c8;
          local_22c = local_4ac;
          local_6c0 = (int *)0x0;
          local_6a0 = 1;
          local_69c = local_4ac;
          local_698 = 1;
          local_694 = 1;
          local_690 = 1;
          elemcount = local_4ac >> 0x1f;
          elempack_00 = local_4ac;
          local_6c8 = local_238;
          local_6b8 = local_240;
          local_6b0 = local_244;
          local_6a8 = local_250;
        }
        local_168 = local_358;
        local_148 = local_368;
        local_78 = local_5f0;
        local_40 = local_5a0;
        local_618 = local_90;
        local_5c8 = local_58;
        dequantize(in_stack_fffffffffffff998,ptr_00,scale_data,bias_data,elemcount,elempack_00);
        ppvVar3 = &local_6c8;
        local_348 = ppvVar3;
        local_188 = ppvVar3;
        if (local_6c0 != (int *)0x0) {
          local_18c = 0xffffffff;
          LOCK();
          local_190 = *local_6c0;
          *local_6c0 = *local_6c0 + -1;
          UNLOCK();
          if (local_190 == 1) {
            if (local_6a8 == (long *)0x0) {
              local_c0 = local_6c8;
              if (local_6c8 != (void *)0x0) {
                free(local_6c8);
              }
            }
            else {
              (**(code **)(*local_6a8 + 0x18))(local_6a8,local_6c8);
            }
          }
        }
        *ppvVar3 = (void *)0x0;
        ppvVar3[2] = (void *)0x0;
        *(undefined4 *)(ppvVar3 + 3) = 0;
        *(undefined4 *)(ppvVar3 + 5) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
        *(undefined4 *)(ppvVar3 + 6) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
        *(undefined4 *)(ppvVar3 + 7) = 0;
        ppvVar3[8] = (void *)0x0;
        ppvVar3[1] = (void *)0x0;
        puVar2 = (undefined8 *)&stack0xfffffffffffff980;
        local_338 = puVar2;
        local_1a8 = puVar2;
        if (scale_data != (Mat *)0x0) {
          local_1ac = 0xffffffff;
          LOCK();
          local_1b0 = *(int *)&scale_data->data;
          *(int *)&scale_data->data = *(int *)&scale_data->data + -1;
          UNLOCK();
          if (local_1b0 == 1) {
            if (local_660 == (long *)0x0) {
              if (bias_data != (Mat *)0x0) {
                free(bias_data);
              }
            }
            else {
              (**(code **)(*local_660 + 0x18))(local_660,bias_data);
            }
          }
        }
        *puVar2 = 0;
        puVar2[2] = 0;
        *(undefined4 *)(puVar2 + 3) = 0;
        *(undefined4 *)(puVar2 + 5) = 0;
        *(undefined4 *)((long)puVar2 + 0x2c) = 0;
        *(undefined4 *)(puVar2 + 6) = 0;
        *(undefined4 *)((long)puVar2 + 0x34) = 0;
        *(undefined4 *)(puVar2 + 7) = 0;
        puVar2[8] = 0;
        puVar2[1] = 0;
      }
    }
    local_474 = 0;
  }
  return local_474;
}

Assistant:

int Dequantize_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 1)
    {
        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const int* intptr = (const int*)bottom_blob + i * elempack;
            float* ptr = (float*)top_blob + i * elempack;

            // assert scale_data_size == 1
            // assert bias_data_size == 0 || bias_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            dequantize(intptr, ptr, scale_data, bias_data, size, 1);
        }
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const int* intptr = bottom_blob.row<const int>(i);
            float* ptr = top_blob.row(i);

            const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;
            const Mat bias_data_i = bias_data_size > 1 ? bias_data.range(i * elempack, elempack) : bias_data;

            dequantize(intptr, ptr, scale_data_i, bias_data_i, w, elempack);
        }
    }

    if (dims == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const int* intptr = bottom_blob.channel(q);
            float* ptr = top_blob.channel(q);

            const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;
            const Mat bias_data_q = bias_data_size > 1 ? bias_data.range(q * elempack, elempack) : bias_data;

            dequantize(intptr, ptr, scale_data_q, bias_data_q, w * h, elempack);
        }
    }

    return 0;
}